

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::checkHasValue(DataDictionary *this,FieldBase *field)

{
  int field_00;
  NoTagValue *this_00;
  allocator<char> local_41;
  string local_40;
  
  if ((this->m_checkFieldsHaveValues == true) && ((field->m_string)._M_string_length == 0)) {
    this_00 = (NoTagValue *)__cxa_allocate_exception(0x58);
    field_00 = field->m_tag;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    NoTagValue::NoTagValue(this_00,field_00,&local_40);
    __cxa_throw(this_00,&NoTagValue::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

EXCEPT(NoTagValue) {
    if (m_checkFieldsHaveValues && !field.getString().length()) {
      throw NoTagValue(field.getTag());
    }
  }